

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t match_path_inclusion(archive_match *a,match *m,wchar_t mbs,void *pn)

{
  wchar_t wVar1;
  int *piVar2;
  int in_EDX;
  wchar_t *p_1;
  char *p;
  wchar_t r;
  wchar_t flag;
  undefined4 in_stack_ffffffffffffffb8;
  wchar_t in_stack_ffffffffffffffbc;
  archive_mstring *in_stack_ffffffffffffffc0;
  archive *in_stack_ffffffffffffffc8;
  wchar_t local_4;
  
  if (in_EDX == 0) {
    wVar1 = archive_mstring_get_wcs
                      (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                       (wchar_t **)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (wVar1 == L'\0') {
      wVar1 = __archive_pathmatch_w
                        ((wchar_t *)in_stack_ffffffffffffffc8,(wchar_t *)in_stack_ffffffffffffffc0,
                         in_stack_ffffffffffffffbc);
      return wVar1;
    }
  }
  else {
    wVar1 = archive_mstring_get_mbs
                      (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                       (char **)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (wVar1 == L'\0') {
      wVar1 = __archive_pathmatch((char *)in_stack_ffffffffffffffc8,
                                  (char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      return wVar1;
    }
  }
  piVar2 = __errno_location();
  if (*piVar2 == 0xc) {
    local_4 = error_nomem((archive_match *)0x119576);
  }
  else {
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

static int
match_path_inclusion(struct archive_match *a, struct match *m,
    int mbs, const void *pn)
{
	int flag = PATHMATCH_NO_ANCHOR_END;
	int r;

	if (mbs) {
		const char *p;
		r = archive_mstring_get_mbs(&(a->archive), &(m->pattern), &p);
		if (r == 0)
			return (archive_pathmatch(p, (const char *)pn, flag));
	} else {
		const wchar_t *p;
		r = archive_mstring_get_wcs(&(a->archive), &(m->pattern), &p);
		if (r == 0)
			return (archive_pathmatch_w(p, (const wchar_t *)pn,
				flag));
	}
	if (errno == ENOMEM)
		return (error_nomem(a));
	return (0);
}